

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

Result<vkb::Swapchain> * __thiscall
vkb::SwapchainBuilder::build(Result<vkb::Swapchain> *__return_storage_ptr__,SwapchainBuilder *this)

{
  Error error;
  Error error_00;
  Error error_01;
  Error error_02;
  Error error_03;
  bool bVar1;
  VkResult VVar2;
  size_type sVar3;
  SurfaceSupportDetails *pSVar4;
  VkSurfaceFormatKHR VVar5;
  VkExtent2D VVar6;
  vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> *this_00;
  VulkanFunctions *pVVar7;
  vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> *this_01;
  error_code eVar8;
  error_code error_code;
  error_code local_318;
  undefined4 local_308;
  uint uStack_304;
  undefined1 local_300 [8];
  Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_> images;
  error_category *local_2d8;
  undefined4 uStack_2cc;
  _func_VkResult_VkDevice_T_ptr_VkSwapchainCreateInfoKHR_ptr_VkAllocationCallbacks_ptr_VkSwapchainKHR_T_ptr_ptr
  *p_Stack_2c0;
  VkResult res;
  PFN_vkCreateSwapchainKHR swapchain_create_proc;
  Swapchain swapchain;
  VkBaseOutStructure **node;
  const_iterator __end1;
  const_iterator __begin1;
  vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> *__range1;
  VkSwapchainCreateInfoKHR swapchain_create_info;
  VkSurfaceTransformFlagBitsKHR local_1c4;
  undefined1 auStack_1c0 [4];
  VkSurfaceTransformFlagBitsKHR pre_transform;
  error_category *local_1b8;
  undefined4 local_1b0;
  uint uStack_1ac;
  anon_class_1_0_00000001 local_1a1;
  VkPresentModeKHR local_1a0;
  uint32_t uStack_19c;
  anon_class_1_0_00000001 is_unextended_present_mode;
  VkPresentModeKHR present_mode;
  uint32_t queue_family_indices [2];
  uint32_t image_array_layers;
  VkExtent2D extent;
  VkSurfaceFormatKHR surface_format;
  uint local_16c;
  undefined1 local_168 [4];
  uint32_t image_count;
  SurfaceSupportDetails surface_support;
  error_code local_f8;
  undefined8 local_e8;
  undefined1 local_e0 [8];
  Result<vkb::detail::SurfaceSupportDetails> surface_support_ret;
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> desired_present_modes;
  undefined1 local_48 [8];
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> desired_formats;
  error_category *local_28;
  uint uStack_1c;
  SwapchainBuilder *this_local;
  
  if ((this->info).surface == (VkSurfaceKHR)0x0) {
    std::error_code::error_code<vkb::SwapchainError,void>
              ((error_code *)
               &desired_formats.
                super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,surface_handle_not_provided);
    error.type._M_cat = local_28;
    error.type._0_8_ =
         desired_formats.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    error._16_8_ = (ulong)uStack_1c << 0x20;
    Result<vkb::Swapchain>::Result(__return_storage_ptr__,error);
    return __return_storage_ptr__;
  }
  std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::vector
            ((vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)local_48,
             &(this->info).desired_formats);
  sVar3 = std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::size
                    ((vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)local_48);
  if (sVar3 == 0) {
    add_desired_formats(this,(vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)
                             local_48);
  }
  std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::vector
            ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)
             &surface_support_ret.m_init,&(this->info).desired_present_modes);
  sVar3 = std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::size
                    ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)
                     &surface_support_ret.m_init);
  if (sVar3 == 0) {
    add_desired_present_modes
              (this,(vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)
                    &surface_support_ret.m_init);
  }
  detail::query_surface_support_details
            ((Result<vkb::detail::SurfaceSupportDetails> *)local_e0,(this->info).physical_device,
             (this->info).surface);
  bVar1 = Result<vkb::detail::SurfaceSupportDetails>::has_value
                    ((Result<vkb::detail::SurfaceSupportDetails> *)local_e0);
  if (!bVar1) {
    std::error_code::error_code<vkb::SwapchainError,void>
              (&local_f8,failed_query_surface_support_details);
    VVar2 = Result<vkb::detail::SurfaceSupportDetails>::vk_result
                      ((Result<vkb::detail::SurfaceSupportDetails> *)local_e0);
    local_e8._0_4_ = VVar2;
    error_00.type._M_cat = local_f8._M_cat;
    error_00.type._M_value = local_f8._M_value;
    error_00.type._4_4_ = local_f8._4_4_;
    error_00._16_8_ = local_e8;
    Result<vkb::Swapchain>::Result(__return_storage_ptr__,error_00);
    surface_support.present_modes.
    super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    goto LAB_00116c35;
  }
  pSVar4 = Result<vkb::detail::SurfaceSupportDetails>::value
                     ((Result<vkb::detail::SurfaceSupportDetails> *)local_e0);
  detail::SurfaceSupportDetails::SurfaceSupportDetails((SurfaceSupportDetails *)local_168,pSVar4);
  if ((this->info).required_min_image_count == 0) {
    if ((this->info).min_image_count == 0) {
      local_16c = (int)local_168 + 1;
    }
    else {
      local_16c = (this->info).min_image_count;
      if (local_16c < (uint)local_168) {
        local_16c = (uint)local_168;
      }
    }
LAB_0011654a:
    if ((image_count != 0) && (image_count < local_16c)) {
      local_16c = image_count;
    }
    VVar5 = detail::find_best_surface_format
                      ((vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)
                       &surface_support.capabilities.supportedUsageFlags,
                       (vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)local_48);
    VVar6 = detail::find_extent((VkSurfaceCapabilitiesKHR *)local_168,(this->info).desired_width,
                                (this->info).desired_height);
    queue_family_indices[0] = (this->info).array_layer_count;
    if (surface_support.capabilities.maxImageExtent.width < (this->info).array_layer_count) {
      queue_family_indices[0] = surface_support.capabilities.maxImageExtent.width;
    }
    if ((this->info).array_layer_count == 0) {
      queue_family_indices[0] = 1;
    }
    uStack_19c = (this->info).graphics_queue_index;
    local_1a0 = detail::find_present_mode
                          ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)
                           &surface_support.formats.
                            super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)
                           &surface_support_ret.m_init);
    bVar1 = build::anon_class_1_0_00000001::operator()(&local_1a1,local_1a0);
    if ((bVar1) &&
       (((this->info).image_usage_flags & surface_support.capabilities.currentTransform) !=
        (this->info).image_usage_flags)) {
      std::error_code::error_code<vkb::SwapchainError,void>
                ((error_code *)auStack_1c0,required_usage_not_supported);
      local_1b0 = 0;
      error_01.type._M_cat = local_1b8;
      error_01.type._M_value = (int)auStack_1c0;
      error_01.type._4_4_ = pre_transform;
      error_01._16_8_ = (ulong)uStack_1ac << 0x20;
      Result<vkb::Swapchain>::Result(__return_storage_ptr__,error_01);
      surface_support.present_modes.
      super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    else {
      local_1c4 = (this->info).pre_transform;
      if ((this->info).pre_transform == 0) {
        local_1c4 = surface_support.capabilities.maxImageArrayLayers;
      }
      swapchain_create_info.pQueueFamilyIndices = (uint32_t *)0x0;
      swapchain_create_info.preTransform = 0;
      swapchain_create_info.compositeAlpha = 0;
      swapchain_create_info.imageUsage = 0;
      swapchain_create_info.imageSharingMode = VK_SHARING_MODE_EXCLUSIVE;
      swapchain_create_info.queueFamilyIndexCount = 0;
      swapchain_create_info._68_4_ = 0;
      swapchain_create_info.imageColorSpace = VK_COLORSPACE_SRGB_NONLINEAR_KHR;
      swapchain_create_info.imageExtent.width = 0;
      swapchain_create_info.imageExtent.height = 0;
      swapchain_create_info.imageArrayLayers = 0;
      swapchain_create_info.surface = (VkSurfaceKHR)0x0;
      swapchain_create_info.minImageCount = 0;
      swapchain_create_info.imageFormat = VK_FORMAT_UNDEFINED;
      swapchain_create_info.pNext = (void *)0x0;
      swapchain_create_info.flags = 0;
      swapchain_create_info._20_4_ = 0;
      swapchain_create_info.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      swapchain_create_info._4_4_ = 0;
      swapchain_create_info.presentMode = VK_PRESENT_MODE_IMMEDIATE_KHR;
      swapchain_create_info.clipped = 0;
      __range1 = (vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_> *)0x3b9acde8;
      detail::setup_pNext_chain<VkSwapchainCreateInfoKHR>
                ((VkSwapchainCreateInfoKHR *)&__range1,&(this->info).pNext_chain);
      this_00 = &(this->info).pNext_chain;
      __end1 = std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>::begin
                         (this_00);
      node = (VkBaseOutStructure **)
             std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>::end(this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<VkBaseOutStructure_*const_*,_std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>_>
                                         *)&node), bVar1) {
        swapchain.internal_table.fp_vkDestroySwapchainKHR =
             (PFN_vkDestroySwapchainKHR)
             __gnu_cxx::
             __normal_iterator<VkBaseOutStructure_*const_*,_std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>_>
             ::operator*(&__end1);
        if ((*(VkBaseOutStructure **)swapchain.internal_table.fp_vkDestroySwapchainKHR)->sType ==
            VK_STRUCTURE_TYPE_APPLICATION_INFO) {
          __assert_fail("node->sType != VK_STRUCTURE_TYPE_APPLICATION_INFO",
                        "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/src/VkBootstrap.cpp"
                        ,0x7b1,"Result<Swapchain> vkb::SwapchainBuilder::build() const");
        }
        __gnu_cxx::
        __normal_iterator<VkBaseOutStructure_*const_*,_std::vector<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>_>
        ::operator++(&__end1);
      }
      swapchain_create_info.pNext =
           (void *)CONCAT44(swapchain_create_info.pNext._4_4_,(this->info).create_flags);
      swapchain_create_info._16_8_ = (this->info).surface;
      extent.width = VVar5.format;
      swapchain_create_info.surface = (VkSurfaceKHR)CONCAT44(extent.width,local_16c);
      extent.height = VVar5.colorSpace;
      swapchain_create_info.minImageCount = extent.height;
      swapchain_create_info.imageFormat = VVar6.width;
      swapchain_create_info.imageColorSpace = VVar6.height;
      swapchain_create_info.imageExtent.width = queue_family_indices[0];
      swapchain_create_info.imageExtent.height = (this->info).image_usage_flags;
      if ((this->info).graphics_queue_index == (this->info).present_queue_index) {
        swapchain_create_info.imageArrayLayers = 0;
      }
      else {
        swapchain_create_info.imageArrayLayers = 1;
        swapchain_create_info.imageUsage = 2;
        swapchain_create_info._64_8_ = &stack0xfffffffffffffe64;
      }
      swapchain_create_info.pQueueFamilyIndices =
           (uint32_t *)CONCAT44((this->info).composite_alpha,local_1c4);
      swapchain_create_info._80_8_ = (ulong)CONCAT14((this->info).clipped,local_1a0) & 0x1ffffffff;
      swapchain_create_info._88_8_ = (this->info).old_swapchain;
      swapchain.internal_table.fp_vkCreateImageView = (PFN_vkCreateImageView)0x0;
      swapchain.internal_table.fp_vkDestroyImageView = (PFN_vkDestroyImageView)0x0;
      swapchain.allocation_callbacks = (VkAllocationCallbacks *)0x0;
      swapchain.internal_table.fp_vkGetSwapchainImagesKHR = (PFN_vkGetSwapchainImagesKHR)0x0;
      swapchain.requested_min_image_count = 0;
      swapchain.present_mode = VK_PRESENT_MODE_IMMEDIATE_KHR;
      swapchain.instance_version = 0;
      swapchain._52_4_ = 0;
      swapchain.color_space = VK_COLORSPACE_SRGB_NONLINEAR_KHR;
      swapchain.image_usage_flags = 0;
      swapchain.extent.width = 0;
      swapchain.extent.height = 0;
      swapchain.swapchain = (VkSwapchainKHR)0x0;
      swapchain.image_count = 0;
      swapchain.image_format = VK_FORMAT_UNDEFINED;
      swapchain_create_proc = (PFN_vkCreateSwapchainKHR)0x0;
      swapchain.device = (VkDevice)0x0;
      Swapchain::Swapchain((Swapchain *)&swapchain_create_proc);
      pVVar7 = detail::vulkan_functions();
      detail::VulkanFunctions::
      get_device_proc_addr<VkResult(*)(VkDevice_T*,VkSwapchainCreateInfoKHR_const*,VkAllocationCallbacks_const*,VkSwapchainKHR_T**)>
                (pVVar7,(this->info).device,&stack0xfffffffffffffd40,"vkCreateSwapchainKHR");
      VVar2 = (*p_Stack_2c0)((this->info).device,(VkSwapchainCreateInfoKHR *)&__range1,
                             (this->info).allocation_callbacks,(VkSwapchainKHR_T **)&swapchain);
      if (VVar2 == VK_SUCCESS) {
        swapchain_create_proc = (PFN_vkCreateSwapchainKHR)(this->info).device;
        swapchain.swapchain = (VkSwapchainKHR)CONCAT44(extent.width,swapchain.swapchain._0_4_);
        swapchain.image_format = (this->info).image_usage_flags;
        swapchain.image_count = extent.height;
        swapchain._24_8_ = VVar6;
        pVVar7 = detail::vulkan_functions();
        detail::VulkanFunctions::
        get_device_proc_addr<VkResult(*)(VkDevice_T*,VkSwapchainKHR_T*,unsigned_int*,VkImage_T**)>
                  (pVVar7,(this->info).device,
                   (_func_VkResult_VkDevice_T_ptr_VkSwapchainKHR_T_ptr_uint_ptr_VkImage_T_ptr_ptr **
                   )&swapchain.allocation_callbacks,"vkGetSwapchainImagesKHR");
        pVVar7 = detail::vulkan_functions();
        detail::VulkanFunctions::
        get_device_proc_addr<VkResult(*)(VkDevice_T*,VkImageViewCreateInfo_const*,VkAllocationCallbacks_const*,VkImageView_T**)>
                  (pVVar7,(this->info).device,
                   (_func_VkResult_VkDevice_T_ptr_VkImageViewCreateInfo_ptr_VkAllocationCallbacks_ptr_VkImageView_T_ptr_ptr
                    **)&swapchain.internal_table,"vkCreateImageView");
        pVVar7 = detail::vulkan_functions();
        detail::VulkanFunctions::
        get_device_proc_addr<void(*)(VkDevice_T*,VkImageView_T*,VkAllocationCallbacks_const*)>
                  (pVVar7,(this->info).device,
                   (_func_void_VkDevice_T_ptr_VkImageView_T_ptr_VkAllocationCallbacks_ptr **)
                   &swapchain.internal_table.fp_vkCreateImageView,"vkDestroyImageView");
        pVVar7 = detail::vulkan_functions();
        detail::VulkanFunctions::
        get_device_proc_addr<void(*)(VkDevice_T*,VkSwapchainKHR_T*,VkAllocationCallbacks_const*)>
                  (pVVar7,(this->info).device,
                   (_func_void_VkDevice_T_ptr_VkSwapchainKHR_T_ptr_VkAllocationCallbacks_ptr **)
                   &swapchain.internal_table.fp_vkDestroyImageView,"vkDestroySwapchainKHR");
        Swapchain::get_images
                  ((Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_> *)local_300,
                   (Swapchain *)&swapchain_create_proc);
        bVar1 = vkb::Result::operator_cast_to_bool((Result *)local_300);
        if (bVar1) {
          swapchain.extent.height = local_1a0;
          swapchain.extent.width = local_16c;
          this_01 = Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_>::value
                              ((Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_> *)
                               local_300);
          sVar3 = std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>::size(this_01);
          swapchain.swapchain = (VkSwapchainKHR)CONCAT44(swapchain.swapchain._4_4_,(int)sVar3);
          swapchain.requested_min_image_count = (this->info).instance_version;
          swapchain._48_8_ = (this->info).allocation_callbacks;
          Result<vkb::Swapchain>::Result(__return_storage_ptr__,(Swapchain *)&swapchain_create_proc)
          ;
        }
        else {
          std::error_code::error_code<vkb::SwapchainError,void>
                    (&local_318,failed_get_swapchain_images);
          local_308 = 0;
          error_03.type._M_cat = local_318._M_cat;
          error_03.type._M_value = local_318._M_value;
          error_03.type._4_4_ = local_318._4_4_;
          error_03._16_8_ = (ulong)uStack_304 << 0x20;
          Result<vkb::Swapchain>::Result(__return_storage_ptr__,error_03);
        }
        surface_support.present_modes.
        super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
        Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_>::~Result
                  ((Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_> *)local_300);
      }
      else {
        std::error_code::error_code<vkb::SwapchainError,void>
                  ((error_code *)&images.m_init,failed_create_swapchain);
        error_02._20_4_ = uStack_2cc;
        error_02.vk_result = VVar2;
        error_02.type._M_cat = local_2d8;
        error_02.type._0_8_ = images._24_8_;
        Result<vkb::Swapchain>::Result(__return_storage_ptr__,error_02);
        surface_support.present_modes.
        super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      }
    }
  }
  else {
    if ((uint)local_168 <= (this->info).required_min_image_count) {
      local_16c = (this->info).required_min_image_count;
      goto LAB_0011654a;
    }
    eVar8 = make_error_code(required_min_image_count_too_low);
    error_code._M_cat = eVar8._M_cat;
    error_code._4_4_ = 0;
    error_code._M_value = eVar8._M_value;
    Result<vkb::Swapchain>::Result(__return_storage_ptr__,error_code,VK_SUCCESS);
    surface_support.present_modes.
    super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  detail::SurfaceSupportDetails::~SurfaceSupportDetails((SurfaceSupportDetails *)local_168);
LAB_00116c35:
  Result<vkb::detail::SurfaceSupportDetails>::~Result
            ((Result<vkb::detail::SurfaceSupportDetails> *)local_e0);
  std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::~vector
            ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)
             &surface_support_ret.m_init);
  std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::~vector
            ((vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result<Swapchain> SwapchainBuilder::build() const {
    if (info.surface == VK_NULL_HANDLE) {
        return Error{ SwapchainError::surface_handle_not_provided };
    }

    auto desired_formats = info.desired_formats;
    if (desired_formats.size() == 0) add_desired_formats(desired_formats);
    auto desired_present_modes = info.desired_present_modes;
    if (desired_present_modes.size() == 0) add_desired_present_modes(desired_present_modes);

    auto surface_support_ret = detail::query_surface_support_details(info.physical_device, info.surface);
    if (!surface_support_ret.has_value())
        return Error{ SwapchainError::failed_query_surface_support_details, surface_support_ret.vk_result() };
    auto surface_support = surface_support_ret.value();

    uint32_t image_count = info.min_image_count;
    if (info.required_min_image_count >= 1) {
        if (info.required_min_image_count < surface_support.capabilities.minImageCount)
            return make_error_code(SwapchainError::required_min_image_count_too_low);

        image_count = info.required_min_image_count;
    } else if (info.min_image_count == 0) {
        // We intentionally use minImageCount + 1 to maintain existing behavior, even if it typically results in triple buffering on most systems.
        image_count = surface_support.capabilities.minImageCount + 1;
    } else {
        image_count = info.min_image_count;
        if (image_count < surface_support.capabilities.minImageCount)
            image_count = surface_support.capabilities.minImageCount;
    }
    if (surface_support.capabilities.maxImageCount > 0 && image_count > surface_support.capabilities.maxImageCount) {
        image_count = surface_support.capabilities.maxImageCount;
    }

    VkSurfaceFormatKHR surface_format = detail::find_best_surface_format(surface_support.formats, desired_formats);

    VkExtent2D extent = detail::find_extent(surface_support.capabilities, info.desired_width, info.desired_height);

    uint32_t image_array_layers = info.array_layer_count;
    if (surface_support.capabilities.maxImageArrayLayers < info.array_layer_count)
        image_array_layers = surface_support.capabilities.maxImageArrayLayers;
    if (info.array_layer_count == 0) image_array_layers = 1;

    uint32_t queue_family_indices[] = { info.graphics_queue_index, info.present_queue_index };


    VkPresentModeKHR present_mode = detail::find_present_mode(surface_support.present_modes, desired_present_modes);

    // VkSurfaceCapabilitiesKHR::supportedUsageFlags is only only valid for some present modes. For shared present modes, we should also check VkSharedPresentSurfaceCapabilitiesKHR::sharedPresentSupportedUsageFlags.
    auto is_unextended_present_mode = [](VkPresentModeKHR present_mode) {
        return (present_mode == VK_PRESENT_MODE_IMMEDIATE_KHR) || (present_mode == VK_PRESENT_MODE_MAILBOX_KHR) ||
               (present_mode == VK_PRESENT_MODE_FIFO_KHR) || (present_mode == VK_PRESENT_MODE_FIFO_RELAXED_KHR);
    };

    if (is_unextended_present_mode(present_mode) &&
        (info.image_usage_flags & surface_support.capabilities.supportedUsageFlags) != info.image_usage_flags) {
        return Error{ SwapchainError::required_usage_not_supported };
    }

    VkSurfaceTransformFlagBitsKHR pre_transform = info.pre_transform;
    if (info.pre_transform == static_cast<VkSurfaceTransformFlagBitsKHR>(0))
        pre_transform = surface_support.capabilities.currentTransform;

    VkSwapchainCreateInfoKHR swapchain_create_info = {};
    swapchain_create_info.sType = VK_STRUCTURE_TYPE_SWAPCHAIN_CREATE_INFO_KHR;
    detail::setup_pNext_chain(swapchain_create_info, info.pNext_chain);
#if !defined(NDEBUG)
    for (auto& node : info.pNext_chain) {
        assert(node->sType != VK_STRUCTURE_TYPE_APPLICATION_INFO);
    }
#endif
    swapchain_create_info.flags = info.create_flags;
    swapchain_create_info.surface = info.surface;
    swapchain_create_info.minImageCount = image_count;
    swapchain_create_info.imageFormat = surface_format.format;
    swapchain_create_info.imageColorSpace = surface_format.colorSpace;
    swapchain_create_info.imageExtent = extent;
    swapchain_create_info.imageArrayLayers = image_array_layers;
    swapchain_create_info.imageUsage = info.image_usage_flags;

    if (info.graphics_queue_index != info.present_queue_index) {
        swapchain_create_info.imageSharingMode = VK_SHARING_MODE_CONCURRENT;
        swapchain_create_info.queueFamilyIndexCount = 2;
        swapchain_create_info.pQueueFamilyIndices = queue_family_indices;
    } else {
        swapchain_create_info.imageSharingMode = VK_SHARING_MODE_EXCLUSIVE;
    }

    swapchain_create_info.preTransform = pre_transform;
    swapchain_create_info.compositeAlpha = info.composite_alpha;
    swapchain_create_info.presentMode = present_mode;
    swapchain_create_info.clipped = info.clipped;
    swapchain_create_info.oldSwapchain = info.old_swapchain;
    Swapchain swapchain{};
    PFN_vkCreateSwapchainKHR swapchain_create_proc;
    detail::vulkan_functions().get_device_proc_addr(info.device, swapchain_create_proc, "vkCreateSwapchainKHR");
    auto res = swapchain_create_proc(info.device, &swapchain_create_info, info.allocation_callbacks, &swapchain.swapchain);

    if (res != VK_SUCCESS) {
        return Error{ SwapchainError::failed_create_swapchain, res };
    }
    swapchain.device = info.device;
    swapchain.image_format = surface_format.format;
    swapchain.color_space = surface_format.colorSpace;
    swapchain.image_usage_flags = info.image_usage_flags;
    swapchain.extent = extent;
    detail::vulkan_functions().get_device_proc_addr(
        info.device, swapchain.internal_table.fp_vkGetSwapchainImagesKHR, "vkGetSwapchainImagesKHR");
    detail::vulkan_functions().get_device_proc_addr(info.device, swapchain.internal_table.fp_vkCreateImageView, "vkCreateImageView");
    detail::vulkan_functions().get_device_proc_addr(info.device, swapchain.internal_table.fp_vkDestroyImageView, "vkDestroyImageView");
    detail::vulkan_functions().get_device_proc_addr(
        info.device, swapchain.internal_table.fp_vkDestroySwapchainKHR, "vkDestroySwapchainKHR");
    auto images = swapchain.get_images();
    if (!images) {
        return Error{ SwapchainError::failed_get_swapchain_images };
    }
    swapchain.requested_min_image_count = image_count;
    swapchain.present_mode = present_mode;
    swapchain.image_count = static_cast<uint32_t>(images.value().size());
    swapchain.instance_version = info.instance_version;
    swapchain.allocation_callbacks = info.allocation_callbacks;
    return swapchain;
}